

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBuffer::Implementation::recordCommands
          (Implementation *this,VkCommandBuffer cmdBuffer)

{
  DeviceInterface *pDVar1;
  Resource *pRVar2;
  VkBufferCopy res;
  VkBufferMemoryBarrier barrier;
  
  pDVar1 = this->m_context->m_vk;
  pRVar2 = this->m_resource;
  res.size = (pRVar2->m_bufferData).size;
  res.srcOffset = 0;
  res.dstOffset = 0;
  if (this->m_mode == ACCESS_MODE_READ) {
    (*pDVar1->_vptr_DeviceInterface[0x5f])
              (pDVar1,cmdBuffer,(pRVar2->m_bufferData).handle.m_internal,
               (deUint64)
               (((this->m_hostBuffer).
                 super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                 .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
               ,1,&res);
    makeBufferMemoryBarrier
              (&barrier,0x1000,0x2000,
               (VkBuffer)
               (((this->m_hostBuffer).
                 super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                 .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
               .m_internal,0,(this->m_resource->m_bufferData).size);
    (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x1000,0x4000,0,0,0,1,&barrier,0,0);
  }
  else {
    (*pDVar1->_vptr_DeviceInterface[0x5f])
              (pDVar1,cmdBuffer,
               (deUint64)
               (((this->m_hostBuffer).
                 super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                 .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
               ,(pRVar2->m_bufferData).handle.m_internal,1,&res);
  }
  return;
}

Assistant:

void recordCommands (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk			= m_context.getDeviceInterface();
		const VkBufferCopy		copyRegion	= makeBufferCopy(0u, 0u, m_resource.getBuffer().size);

		if (m_mode == ACCESS_MODE_READ)
		{
			vk.cmdCopyBuffer(cmdBuffer, m_resource.getBuffer().handle, **m_hostBuffer, 1u, &copyRegion);

			// Insert a barrier so copied data is available to the host
			const VkBufferMemoryBarrier	barrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **m_hostBuffer, 0u, m_resource.getBuffer().size);
			vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}
		else
			vk.cmdCopyBuffer(cmdBuffer, **m_hostBuffer, m_resource.getBuffer().handle, 1u, &copyRegion);
	}